

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathIdFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr pxVar1;
  xmlNodeSetPtr val;
  xmlChar *ids;
  xmlNodeSetPtr pxVar2;
  xmlXPathObjectPtr value;
  long lVar3;
  int iStack_40;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueFrame < ctxt->valueNr) {
      pxVar1 = valuePop(ctxt);
      if (pxVar1 != (xmlXPathObjectPtr)0x0) {
        if ((pxVar1->type | XPATH_USERS) == XPATH_XSLT_TREE) {
          val = xmlXPathNodeSetCreate((xmlNodePtr)0x0);
          pxVar2 = pxVar1->nodesetval;
          if (pxVar2 != (xmlNodeSetPtr)0x0) {
            for (lVar3 = 0; lVar3 < pxVar2->nodeNr; lVar3 = lVar3 + 1) {
              ids = xmlXPathCastNodeToString(pxVar2->nodeTab[lVar3]);
              pxVar2 = xmlXPathGetElementsByIds(ctxt->context->doc,ids);
              val = xmlXPathNodeSetMerge(val,pxVar2);
              xmlXPathFreeNodeSet(pxVar2);
              if (ids != (xmlChar *)0x0) {
                (*xmlFree)(ids);
              }
              pxVar2 = pxVar1->nodesetval;
            }
          }
          xmlXPathReleaseObject(ctxt->context,pxVar1);
          pxVar1 = xmlXPathCacheWrapNodeSet(ctxt->context,val);
          valuePush(ctxt,pxVar1);
          return;
        }
        pxVar1 = xmlXPathCacheConvertString(ctxt->context,pxVar1);
        if (pxVar1 == (xmlXPathObjectPtr)0x0) {
          return;
        }
        pxVar2 = xmlXPathGetElementsByIds(ctxt->context->doc,pxVar1->stringval);
        value = xmlXPathCacheWrapNodeSet(ctxt->context,pxVar2);
        valuePush(ctxt,value);
        xmlXPathReleaseObject(ctxt->context,pxVar1);
        return;
      }
      iStack_40 = 10;
    }
    else {
      iStack_40 = 0x17;
    }
  }
  else {
    iStack_40 = 0xc;
  }
  xmlXPathErr(ctxt,iStack_40);
  return;
}

Assistant:

void
xmlXPathIdFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlChar *tokens;
    xmlNodeSetPtr ret;
    xmlXPathObjectPtr obj;

    CHECK_ARITY(1);
    obj = valuePop(ctxt);
    if (obj == NULL) XP_ERROR(XPATH_INVALID_OPERAND);
    if ((obj->type == XPATH_NODESET) || (obj->type == XPATH_XSLT_TREE)) {
	xmlNodeSetPtr ns;
	int i;

        /* TODO: Check memory error. */
	ret = xmlXPathNodeSetCreate(NULL);

	if (obj->nodesetval != NULL) {
	    for (i = 0; i < obj->nodesetval->nodeNr; i++) {
		tokens =
		    xmlXPathCastNodeToString(obj->nodesetval->nodeTab[i]);
		ns = xmlXPathGetElementsByIds(ctxt->context->doc, tokens);
                /* TODO: Check memory error. */
		ret = xmlXPathNodeSetMerge(ret, ns);
		xmlXPathFreeNodeSet(ns);
		if (tokens != NULL)
		    xmlFree(tokens);
	    }
	}
	xmlXPathReleaseObject(ctxt->context, obj);
	valuePush(ctxt, xmlXPathCacheWrapNodeSet(ctxt->context, ret));
	return;
    }
    obj = xmlXPathCacheConvertString(ctxt->context, obj);
    if (obj == NULL) return;
    ret = xmlXPathGetElementsByIds(ctxt->context->doc, obj->stringval);
    valuePush(ctxt, xmlXPathCacheWrapNodeSet(ctxt->context, ret));
    xmlXPathReleaseObject(ctxt->context, obj);
    return;
}